

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch(DeviceContextVkImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  PIPELINE_SHADING_RATE_FLAGS PVar3;
  int iVar4;
  PipelineStateVkImpl *pPVar5;
  ostream *poVar6;
  TextureViewVkImpl *pTVar7;
  ITexture *pIVar8;
  undefined4 extraout_var;
  Char *pCVar9;
  undefined4 extraout_var_00;
  TextureViewDesc *pTVar10;
  TextureFormatAttribs *pTVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  RefCntAutoPtr<Diligent::PipelineStateVkImpl> *this_00;
  Diligent local_250 [32];
  undefined1 local_230 [8];
  string _msg;
  undefined1 local_208 [4];
  Uint32 rt_1;
  string msg_1;
  string msg;
  TextureViewVkImpl *pRTV;
  uint local_1b8;
  Uint32 rt;
  Uint32 SampleCount;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  GraphicsPipelineDesc *local_20;
  GraphicsPipelineDesc *GrPipeline;
  PipelineStateDesc *Desc;
  DeviceContextVkImpl *this_local;
  
  this_00 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState;
  Desc = (PipelineStateDesc *)this;
  pPVar5 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(this_00);
  GrPipeline = (GraphicsPipelineDesc *)
               PipelineStateBase<Diligent::EngineVkImplTraits>::GetDesc
                         (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  pPVar5 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->(this_00);
  local_20 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar5->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar6 = std::operator<<(local_198,"Active render pass is incompatible with PSO \'");
  poVar6 = std::operator<<(poVar6,*(char **)&GrPipeline->BlendDesc);
  poVar6 = std::operator<<(poVar6,
                           "\'. This indicates the mismatch between the number and/or format of bound render targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n    Bound render targets ("
                          );
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (poVar6,(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                             super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                             m_NumBoundRenderTargets);
  std::operator<<(poVar6,"):");
  local_1b8 = 0;
  for (pRTV._4_4_ = 0;
      pRTV._4_4_ <
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
      pRTV._4_4_ = pRTV._4_4_ + 1) {
    std::operator<<(local_198,' ');
    pTVar7 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                       ((RefCntAutoPtr *)
                        ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets
                        + pRTV._4_4_));
    if (pTVar7 == (TextureViewVkImpl *)0x0) {
      std::operator<<(local_198,"<Not set>");
    }
    else {
      if (local_1b8 != 0) {
        pIVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                           (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
        iVar4 = (*(pIVar8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        if (local_1b8 != *(uint *)(*(char (*) [77])CONCAT44(extraout_var,iVar4) + 0x20)) {
          FormatString<char[26],char[77]>
                    ((string *)((long)&msg_1.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount",
                     (char (*) [77])CONCAT44(extraout_var,iVar4));
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"DvpLogRenderPass_PSOMismatch",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x2b1);
          std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
        }
      }
      pIVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                         (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
      iVar4 = (*(pIVar8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      local_1b8 = *(uint *)(CONCAT44(extraout_var_00,iVar4) + 0x20);
      pTVar10 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                           *)pTVar7);
      pTVar11 = GetTextureFormatAttribs(pTVar10->Format);
      std::operator<<(local_198,pTVar11->Name);
    }
  }
  std::operator<<(local_198,"; DSV: ");
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil);
  if (bVar2) {
    if (local_1b8 != 0) {
      pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                           m_pBoundDepthStencil);
      pIVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                         (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
      iVar4 = (*(pIVar8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      if (local_1b8 != *(uint *)(*(char (*) [93])CONCAT44(extraout_var_01,iVar4) + 0x20)) {
        FormatString<char[26],char[93]>
                  ((string *)local_208,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount"
                   ,(char (*) [93])CONCAT44(extraout_var_01,iVar4));
        pCVar9 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar9,"DvpLogRenderPass_PSOMismatch",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,699);
        std::__cxx11::string::~string((string *)local_208);
      }
    }
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pIVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture
                       (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
    iVar4 = (*(pIVar8->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    local_1b8 = *(uint *)(CONCAT44(extraout_var_02,iVar4) + 0x20);
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar10 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         *)pTVar7);
    pTVar11 = GetTextureFormatAttribs(pTVar10->Format);
    std::operator<<(local_198,pTVar11->Name);
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar10 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
              ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         *)pTVar7);
    if (pTVar10->ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) {
      std::operator<<(local_198," (read-only)");
    }
  }
  else {
    std::operator<<(local_198,"<Not set>");
  }
  poVar6 = std::operator<<(local_198,"; Sample count: ");
  std::ostream::operator<<(poVar6,local_1b8);
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap);
  if (bVar2) {
    std::operator<<(local_198,"; VRS");
  }
  poVar6 = std::operator<<(local_198,"\n    PSO: render targets (");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)local_20->NumRenderTargets);
  std::operator<<(poVar6,"): ");
  for (_msg.field_2._12_4_ = 0; (uint)_msg.field_2._12_4_ < (uint)local_20->NumRenderTargets;
      _msg.field_2._12_4_ = _msg.field_2._12_4_ + 1) {
    poVar6 = std::operator<<(local_198,' ');
    pTVar11 = GetTextureFormatAttribs(local_20->RTVFormats[(uint)_msg.field_2._12_4_]);
    std::operator<<(poVar6,pTVar11->Name);
  }
  poVar6 = std::operator<<(local_198,"; DSV: ");
  pTVar11 = GetTextureFormatAttribs(local_20->DSVFormat);
  std::operator<<(poVar6,pTVar11->Name);
  if ((local_20->ReadOnlyDSV & 1U) != 0) {
    std::operator<<(local_198," (read-only)");
  }
  poVar6 = std::operator<<(local_198,"; Sample count: ");
  std::ostream::operator<<(poVar6,(uint)(local_20->SmplDesc).Count);
  PVar3 = Diligent::operator&(local_20->ShadingRateFlags,PIPELINE_SHADING_RATE_FLAG_LAST);
  if (PVar3 != PIPELINE_SHADING_RATE_FLAG_NONE) {
    std::operator<<(local_198,"; VRS");
  }
  std::__cxx11::stringstream::str();
  FormatString<std::__cxx11::string>((string *)local_230,local_250,Args);
  std::__cxx11::string::~string((string *)local_250);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar12 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(2,uVar12,0);
  }
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void DeviceContextVkImpl::DvpLogRenderPass_PSOMismatch()
{
    const PipelineStateDesc&    Desc       = m_pPipelineState->GetDesc();
    const GraphicsPipelineDesc& GrPipeline = m_pPipelineState->GetGraphicsPipelineDesc();

    std::stringstream ss;
    ss << "Active render pass is incompatible with PSO '" << Desc.Name
       << "'. This indicates the mismatch between the number and/or format of bound render "
          "targets and/or depth stencil buffer and the PSO. Vulkan requires exact match.\n"
          "    Bound render targets ("
       << m_NumBoundRenderTargets << "):";
    Uint32 SampleCount = 0;
    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        ss << ' ';
        if (TextureViewVkImpl* pRTV = m_pBoundRenderTargets[rt])
        {
            VERIFY_EXPR(SampleCount == 0 || SampleCount == pRTV->GetTexture()->GetDesc().SampleCount);
            SampleCount = pRTV->GetTexture()->GetDesc().SampleCount;
            ss << GetTextureFormatAttribs(pRTV->GetDesc().Format).Name;
        }
        else
            ss << "<Not set>";
    }
    ss << "; DSV: ";
    if (m_pBoundDepthStencil)
    {
        VERIFY_EXPR(SampleCount == 0 || SampleCount == m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount);
        SampleCount = m_pBoundDepthStencil->GetTexture()->GetDesc().SampleCount;
        ss << GetTextureFormatAttribs(m_pBoundDepthStencil->GetDesc().Format).Name;
        if (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            ss << " (read-only)";
    }
    else
        ss << "<Not set>";
    ss << "; Sample count: " << SampleCount;

    if (m_pBoundShadingRateMap)
        ss << "; VRS";

    ss << "\n    PSO: render targets (" << Uint32{GrPipeline.NumRenderTargets} << "): ";
    for (Uint32 rt = 0; rt < GrPipeline.NumRenderTargets; ++rt)
        ss << ' ' << GetTextureFormatAttribs(GrPipeline.RTVFormats[rt]).Name;
    ss << "; DSV: " << GetTextureFormatAttribs(GrPipeline.DSVFormat).Name;
    if (GrPipeline.ReadOnlyDSV)
        ss << " (read-only)";
    ss << "; Sample count: " << Uint32{GrPipeline.SmplDesc.Count};

    if (GrPipeline.ShadingRateFlags & PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED)
        ss << "; VRS";

    LOG_ERROR_MESSAGE(ss.str());
}